

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_4_P::LoadableGetStateBlock_x
          (ChElementTetraCorot_4_P *this,int block_offset,ChState *mD)

{
  Scalar SVar1;
  Scalar *pSVar2;
  
  SVar1 = ((((this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->P;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)mD,
                      (long)block_offset);
  *pSVar2 = SVar1;
  SVar1 = ((this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->P;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)mD,
                      (long)(block_offset + 1));
  *pSVar2 = SVar1;
  SVar1 = ((this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->P;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)mD,
                      (long)(block_offset + 2));
  *pSVar2 = SVar1;
  SVar1 = ((this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->P;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)mD,
                      (long)(block_offset + 3));
  *pSVar2 = SVar1;
  return;
}

Assistant:

void ChElementTetraCorot_4_P::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD(block_offset) = this->nodes[0]->GetP();
    mD(block_offset + 1) = this->nodes[1]->GetP();
    mD(block_offset + 2) = this->nodes[2]->GetP();
    mD(block_offset + 3) = this->nodes[3]->GetP();
}